

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_verboseconnect(Curl_easy *data,connectdata *conn)

{
  char *local_38;
  char *local_30;
  char *local_28;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((*(ulong *)&(data->set).field_0x8e2 >> 0x1b & 1) != 0) {
    if ((*(uint *)&(conn->bits).field_0x4 >> 1 & 1) == 0) {
      if ((*(uint *)&(conn->bits).field_0x4 & 1) == 0) {
        if ((*(uint *)&(conn->bits).field_0x4 >> 9 & 1) == 0) {
          local_38 = (conn->host).dispname;
        }
        else {
          local_38 = (conn->conn_to_host).dispname;
        }
        local_30 = local_38;
      }
      else {
        local_30 = (conn->http_proxy).host.dispname;
      }
      local_28 = local_30;
    }
    else {
      local_28 = (conn->socks_proxy).host.dispname;
    }
    Curl_infof(data,"Connected to %s (%s) port %u (#%ld)",local_28,conn->primary_ip,
               (ulong)(uint)conn->port,conn->connection_id);
  }
  return;
}

Assistant:

void Curl_verboseconnect(struct Curl_easy *data,
                         struct connectdata *conn)
{
  if(data->set.verbose)
    infof(data, "Connected to %s (%s) port %u (#%ld)",
#ifndef CURL_DISABLE_PROXY
          conn->bits.socksproxy ? conn->socks_proxy.host.dispname :
          conn->bits.httpproxy ? conn->http_proxy.host.dispname :
#endif
          conn->bits.conn_to_host ? conn->conn_to_host.dispname :
          conn->host.dispname,
          conn->primary_ip, conn->port, conn->connection_id);
}